

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

string * testing::internal::FormatDeathTestOutput(string *__return_storage_ptr__,string *output)

{
  long lVar1;
  string *extraout_RAX;
  string *psVar2;
  string *local_58 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    lVar1 = std::__cxx11::string::find((char)output,10);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (lVar1 == -1) break;
    std::__cxx11::string::substr((ulong)local_58,(ulong)output);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
    if (local_58[0] != (string *)(local_58 + 2)) {
      operator_delete(local_58[0]);
    }
  }
  std::__cxx11::string::substr((ulong)local_58,(ulong)output);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
  psVar2 = (string *)(local_58 + 2);
  if (local_58[0] != psVar2) {
    operator_delete(local_58[0]);
    psVar2 = extraout_RAX;
  }
  return psVar2;
}

Assistant:

static ::std::string FormatDeathTestOutput(const ::std::string& output) {
  ::std::string ret;
  for (size_t at = 0; ; ) {
    const size_t line_end = output.find('\n', at);
    ret += "[  DEATH   ] ";
    if (line_end == ::std::string::npos) {
      ret += output.substr(at);
      break;
    }
    ret += output.substr(at, line_end + 1 - at);
    at = line_end + 1;
  }
  return ret;
}